

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

bool __thiscall LinearNE<0,_1,_0>::propagate(LinearNE<0,_1,_0> *this)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  anon_union_8_2_743a5d44_for_Reason_0 aVar14;
  long lVar15;
  Clause *c;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  
  if ((this->num_unfixed).v == 0) {
    if ((this->sum_fixed).v != 0) {
      return true;
    }
    if (so.lazy) {
      iVar8 = this->sz;
      local_38._pt = (Clause *)malloc((long)iVar8 * 4 + 0xc);
      *(uint *)local_38._pt = (*(uint *)local_38._pt & 0xfc) + (iVar8 + 1) * 0x100 + 2;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38._pt);
      aVar14 = local_38;
      if (0 < this->sz) {
        lVar12 = 0;
        uVar13 = 1;
        do {
          iVar8 = (**(code **)(**(long **)((long)&this->x->var + lVar12) + 0x50))();
          if (*(uint *)aVar14._pt >> 8 <= uVar13) goto LAB_001ab226;
          (aVar14._pt)->data[uVar13].x = iVar8;
          lVar12 = lVar12 + 0x10;
          bVar5 = (long)uVar13 < (long)this->sz;
          uVar13 = uVar13 + 1;
        } while (bVar5);
      }
    }
    else {
      aVar14._pt = (Clause *)0x0;
    }
    SAT::cEnqueue(&sat,(Lit)(((this->r).s ^ 1) + (this->r).v * 2),(Reason)aVar14);
    return sat.confl == (Clause *)0x0;
  }
  uVar13 = 0;
  lVar12 = 0;
  do {
    lVar11 = lVar12;
    lVar15 = *(long *)((long)&this->x->var + lVar11);
    lVar12 = lVar11 + 0x10;
    uVar13 = uVar13 - 1;
  } while (*(int *)(lVar15 + 0xc) == *(int *)(lVar15 + 0x10));
  iVar8 = this->sz;
  iVar2 = *(int *)&(this->super_Propagator).field_0x14;
  iVar10 = (int)~uVar13;
  if (iVar10 < iVar2) {
    lVar3 = -(this->sum_fixed).v;
    if ((lVar3 <= *(int *)(lVar15 + 0x10) && *(int *)(lVar15 + 0xc) <= lVar3) &&
       ((*(long *)(lVar15 + 0x28) == 0 || (*(char *)(*(long *)(lVar15 + 0x28) + lVar3) != '\0'))))
    goto LAB_001ab0a7;
    if (iVar10 < iVar2) {
      return true;
    }
  }
  lVar15 = (this->sum_fixed).v;
  lVar3 = *(long *)((long)&this->y->var + lVar11);
  if (lVar15 < *(int *)(lVar3 + 0xc)) {
    return true;
  }
  if (*(int *)(lVar3 + 0x10) < lVar15) {
    return true;
  }
  if ((*(long *)(lVar3 + 0x28) != 0) && (*(char *)(*(long *)(lVar3 + 0x28) + lVar15) == '\0')) {
    return true;
  }
LAB_001ab0a7:
  if (so.lazy) {
    local_38._pt = (Clause *)malloc((long)iVar8 * 4 + 8);
    *(uint *)local_38._pt = (*(uint *)local_38._pt & 0xfc) + iVar8 * 0x100 + 2;
    vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38._pt);
    aVar14 = local_38;
    if (lVar12 != 0x10) {
      lVar15 = 0;
      uVar9 = 0;
      do {
        uVar7 = (**(code **)(**(long **)((long)&this->x->var + lVar15) + 0x50))();
        uVar1 = uVar9 + 1;
        if (*(uint *)aVar14._pt >> 8 <= uVar1) goto LAB_001ab226;
        ((uint *)(aVar14._a + 8))[uVar9] = uVar7;
        lVar15 = lVar15 + 0x10;
        uVar9 = uVar1;
      } while (~uVar13 != uVar1);
    }
    uVar13 = -uVar13;
    if ((int)uVar13 < this->sz) {
      do {
        iVar8 = (**(code **)(**(long **)((long)&this->x->var + lVar12) + 0x50))();
        if (*(uint *)aVar14._pt >> 8 <= uVar13) {
LAB_001ab226:
          abort();
        }
        (aVar14._pt)->data[uVar13].x = iVar8;
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x10;
      } while ((int)uVar13 < this->sz);
    }
  }
  else {
    aVar14._pt = (Clause *)0x0;
  }
  if (iVar10 < *(int *)&(this->super_Propagator).field_0x14) {
    plVar4 = *(long **)((long)&this->x->var + lVar11);
    cVar6 = (**(code **)(*plVar4 + 0x88))(plVar4,-(this->sum_fixed).v,aVar14._pt,1);
    if (cVar6 == '\0') {
      return false;
    }
  }
  else {
    plVar4 = *(long **)((long)&this->y->var + lVar11);
    cVar6 = (**(code **)(*plVar4 + 0x88))(plVar4,(this->sum_fixed).v,aVar14._pt,1);
    if (cVar6 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		assert(num_unfixed <= 1);

		if (num_unfixed == 0) {
			if (sum_fixed == 0) {
				Clause* m_r = nullptr;
				if (so.lazy) {
					m_r = Reason_new(sz + 1);
					for (int i = 0; i < sz; i++) {
						(*m_r)[i + 1] = x[i].getValLit();
					}
				}
				return r.setVal(false, m_r);
			}
			return true;
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		assert(num_unfixed == 1);

		int k = 0;
		while (x[k].isFixed()) {
			k++;
		}
		assert(k < sz);
		for (int i = k + 1; i < sz; i++) {
			assert(x[i].isFixed());
		}

		if ((k < sp && x[k].remValNotR(-sum_fixed)) || (k >= sp && y[k].remValNotR(-sum_fixed))) {
			Clause* m_r = nullptr;
			if (so.lazy) {
				m_r = Reason_new(sz + R);
				for (int i = 0; i < k; i++) {
					(*m_r)[i + 1] = x[i].getValLit();
				}
				for (int i = k + 1; i < sz; i++) {
					(*m_r)[i] = x[i].getValLit();
				}
				if (R != 0) {
					(*m_r)[sz] = r.getValLit();
				}
			}
			if (k < sp) {
				if (!x[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			} else {
				if (!y[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			}
		}

		return true;
	}